

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O2

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties
               (cmGeneratorTarget *target,ostream *os,ImportPropertyMap *properties,
               GenerateType type,string *config)

{
  _Base_ptr __lhs;
  cmMakefile *this;
  auto_ptr<cmCompiledGeneratorExpression> this_00;
  bool bVar1;
  bool bVar2;
  PolicyStatus PVar3;
  TargetType TVar4;
  ostream *poVar5;
  cmLocalGenerator *pcVar6;
  cmGeneratorTarget *this_01;
  _Base_ptr p_Var7;
  cmLinkImplementation *pcVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  char *pcVar10;
  _Alloc_hider _Var11;
  pointer name;
  allocator local_289;
  _Base_ptr local_288;
  GenerateType local_27c;
  string sharedLibs;
  string ldlibs;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libraries;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string evaluated;
  cmGeneratorExpression ge;
  ostringstream w;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  local_27c = type;
  PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
  if ((PVar3 == WARN) || (PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0022(target), PVar3 == OLD))
  {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    pcVar10 = "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    if (local_27c == BUILD) {
      pcVar10 = "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    }
    std::operator<<((ostream *)&w,pcVar10);
    poVar5 = std::operator<<((ostream *)&w," set to OLD for target ");
    poVar5 = std::operator<<(poVar5,(string *)&target->Target->Name);
    poVar5 = std::operator<<(poVar5,". ");
    std::operator<<(poVar5,"The export will only work with CMP0022 set to NEW.");
    this = target->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this,AUTHOR_WARNING,&sharedLibs);
    std::__cxx11::string::~string((string *)&sharedLibs);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
  }
  if ((properties->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::operator<<(os,"LOCAL_CPP_FEATURES := rtti exceptions\n");
    for (p_Var7 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(properties->_M_t)._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      __lhs = p_Var7 + 1;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"INTERFACE_COMPILE_OPTIONS");
      if (bVar1) {
        std::operator<<(os,"LOCAL_CPP_FEATURES += ");
        poVar5 = os;
LAB_0038c789:
        poVar5 = std::operator<<(poVar5,(string *)(p_Var7 + 2));
        std::operator<<(poVar5,"\n");
      }
      else {
        local_288 = p_Var7;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"INTERFACE_LINK_LIBRARIES");
        if (bVar1) {
          libraries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          libraries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          libraries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::ExpandListArgument((string *)(local_288 + 2),&libraries,false);
          _w = (pointer)local_198;
          sharedLibs._M_dataplus._M_p = (pointer)&sharedLibs.field_2;
          sharedLibs._M_string_length = 0;
          ldlibs._M_dataplus._M_p = (pointer)&ldlibs.field_2;
          ldlibs._M_string_length = 0;
          local_198[0]._M_local_buf[0] = '\0';
          sharedLibs.field_2._M_local_buf[0] = '\0';
          ldlibs.field_2._M_allocated_capacity =
               ldlibs.field_2._M_allocated_capacity & 0xffffffffffffff00;
          for (name = libraries.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
              name != libraries.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; name = name + 1) {
            pcVar6 = cmGeneratorTarget::GetLocalGenerator(target);
            this_01 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar6,name);
            if (this_01 == (cmGeneratorTarget *)0x0) {
              cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&evaluated);
              cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&evaluated);
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&evaluated);
              cmGeneratorExpression::Parse
                        ((cmGeneratorExpression *)&evaluated,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ge);
              cge.x_ = (cmCompiledGeneratorExpression *)evaluated._M_dataplus;
              evaluated._M_dataplus._M_p = (pointer)0x0;
              ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                        ((auto_ptr<cmCompiledGeneratorExpression> *)&evaluated);
              this_00 = cge;
              pcVar6 = cmGeneratorTarget::GetLocalGenerator(target);
              local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
              local_208._M_string_length = 0;
              local_208.field_2._M_local_buf[0] = '\0';
              pcVar10 = cmCompiledGeneratorExpression::Evaluate
                                  (this_00.x_,pcVar6,config,false,(cmGeneratorTarget *)0x0,
                                   (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                                   &local_208);
              std::__cxx11::string::string((string *)&evaluated,pcVar10,&local_289);
              std::__cxx11::string::~string((string *)&local_208);
              if (local_27c == INSTALL) {
                std::__cxx11::string::substr((ulong)&local_208,(ulong)name);
                bVar1 = std::operator==(&local_208,"../");
                std::__cxx11::string::~string((string *)&local_208);
              }
              else {
                bVar1 = false;
              }
              bVar2 = cmsys::SystemTools::FileIsFullPath(&evaluated);
              if (bVar2) {
LAB_0038c9b7:
                std::operator+(&local_208," ",&evaluated);
                std::__cxx11::string::append((string *)&ldlibs);
LAB_0038c9d6:
                std::__cxx11::string::~string((string *)&local_208);
              }
              else {
                std::__cxx11::string::substr((ulong)&local_208,(ulong)&evaluated);
                bVar2 = std::operator==(&local_208,"-l");
                std::__cxx11::string::~string((string *)&local_208);
                if ((bVar1 | bVar2) == 1) goto LAB_0038c9b7;
                if (evaluated._M_string_length != 0) {
                  std::operator+(&local_208," -l",&evaluated);
                  std::__cxx11::string::append((string *)&ldlibs);
                  goto LAB_0038c9d6;
                }
              }
              std::__cxx11::string::~string((string *)&evaluated);
              ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
              cmGeneratorExpression::~cmGeneratorExpression(&ge);
            }
            else {
              TVar4 = cmGeneratorTarget::GetType(this_01);
              if ((TVar4 == SHARED_LIBRARY) ||
                 (TVar4 = cmGeneratorTarget::GetType(this_01), TVar4 == MODULE_LIBRARY)) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ge," ",name);
                std::__cxx11::string::append((string *)&sharedLibs);
              }
              else {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ge," ",name);
                std::__cxx11::string::append((string *)&w);
              }
              std::__cxx11::string::~string((string *)&ge);
            }
          }
          if (sharedLibs._M_string_length != 0) {
            poVar5 = std::operator<<(os,"LOCAL_SHARED_LIBRARIES :=");
            poVar5 = std::operator<<(poVar5,(string *)&sharedLibs);
            std::operator<<(poVar5,"\n");
          }
          if (ldlibs._M_string_length != 0) {
            poVar5 = std::operator<<(os,"LOCAL_EXPORT_LDLIBS :=");
            poVar5 = std::operator<<(poVar5,(string *)&ldlibs);
            std::operator<<(poVar5,"\n");
          }
          std::__cxx11::string::~string((string *)&ldlibs);
          std::__cxx11::string::~string((string *)&sharedLibs);
          std::__cxx11::string::~string((string *)&w);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&libraries);
          p_Var7 = local_288;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"INTERFACE_INCLUDE_DIRECTORIES");
          if (!bVar1) {
            poVar5 = std::operator<<(os,"# ");
            poVar5 = std::operator<<(poVar5,(string *)__lhs);
            poVar5 = std::operator<<(poVar5," ");
            p_Var7 = local_288;
            goto LAB_0038c789;
          }
          std::__cxx11::string::string((string *)&w,(string *)(local_288 + 2));
          ldlibs._M_dataplus._M_p = (pointer)0x0;
          ldlibs._M_string_length = 0;
          ldlibs.field_2._M_allocated_capacity = 0;
          cmSystemTools::ExpandListArgument
                    ((string *)&w,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&ldlibs,false);
          std::operator<<(os,"LOCAL_EXPORT_C_INCLUDES := ");
          sharedLibs._M_dataplus._M_p = (pointer)&sharedLibs.field_2;
          sharedLibs._M_string_length = 0;
          sharedLibs.field_2._M_local_buf[0] = '\0';
          for (_Var11 = ldlibs._M_dataplus; _Var11._M_p != (pointer)ldlibs._M_string_length;
              _Var11._M_p = _Var11._M_p + 0x20) {
            poVar5 = std::operator<<(os,(string *)&sharedLibs);
            std::operator<<(poVar5,(string *)_Var11._M_p);
            std::__cxx11::string::assign((char *)&sharedLibs);
          }
          std::operator<<(os,"\n");
          std::__cxx11::string::~string((string *)&sharedLibs);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ldlibs);
          std::__cxx11::string::~string((string *)&w);
          p_Var7 = local_288;
        }
      }
    }
  }
  TVar4 = cmGeneratorTarget::GetType(target);
  if (TVar4 == STATIC_LIBRARY) {
    pcVar8 = cmGeneratorTarget::GetLinkImplementation(target,config);
    _Var9 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[4]>>
                      ((pcVar8->Languages).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pcVar8->Languages).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"CXX");
    if (_Var9._M_current !=
        (pcVar8->Languages).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::operator<<(os,"LOCAL_HAS_CPP := true\n");
    }
  }
  TVar4 = cmGeneratorTarget::GetType(target);
  if (TVar4 - STATIC_LIBRARY < 3) {
    std::operator<<(os,&DAT_0052675c + *(int *)(&DAT_0052675c + (ulong)(TVar4 - STATIC_LIBRARY) * 4)
                   );
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
  const cmGeneratorTarget* target, std::ostream& os,
  const ImportPropertyMap& properties, GenerateType type,
  std::string const& config)
{
  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;
  if (!newCMP0022Behavior) {
    std::ostringstream w;
    if (type == cmExportBuildAndroidMKGenerator::BUILD) {
      w << "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    } else {
      w << "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    }
    w << " set to OLD for target " << target->Target->GetName() << ". "
      << "The export will only work with CMP0022 set to NEW.";
    target->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
  }
  if (!properties.empty()) {
    os << "LOCAL_CPP_FEATURES := rtti exceptions\n";
    for (ImportPropertyMap::const_iterator pi = properties.begin();
         pi != properties.end(); ++pi) {
      if (pi->first == "INTERFACE_COMPILE_OPTIONS") {
        os << "LOCAL_CPP_FEATURES += ";
        os << (pi->second) << "\n";
      } else if (pi->first == "INTERFACE_LINK_LIBRARIES") {
        // need to look at list in pi->second and see if static or shared
        // FindTargetToLink
        // target->GetLocalGenerator()->FindGeneratorTargetToUse()
        // then add to LOCAL_CPPFLAGS
        std::vector<std::string> libraries;
        cmSystemTools::ExpandListArgument(pi->second, libraries);
        std::string staticLibs;
        std::string sharedLibs;
        std::string ldlibs;
        for (std::vector<std::string>::iterator i = libraries.begin();
             i != libraries.end(); ++i) {
          cmGeneratorTarget* gt =
            target->GetLocalGenerator()->FindGeneratorTargetToUse(*i);
          if (gt) {

            if (gt->GetType() == cmStateEnums::SHARED_LIBRARY ||
                gt->GetType() == cmStateEnums::MODULE_LIBRARY) {
              sharedLibs += " " + *i;
            } else {
              staticLibs += " " + *i;
            }
          } else {
            // evaluate any generator expressions with the current
            // build type of the makefile
            cmGeneratorExpression ge;
            CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(*i);
            std::string evaluated =
              cge->Evaluate(target->GetLocalGenerator(), config);
            bool relpath = false;
            if (type == cmExportBuildAndroidMKGenerator::INSTALL) {
              relpath = i->substr(0, 3) == "../";
            }
            // check for full path or if it already has a -l, or
            // in the case of an install check for relative paths
            // if it is full or a link library then use string directly
            if (cmSystemTools::FileIsFullPath(evaluated) ||
                evaluated.substr(0, 2) == "-l" || relpath) {
              ldlibs += " " + evaluated;
              // if it is not a path and does not have a -l then add -l
            } else if (!evaluated.empty()) {
              ldlibs += " -l" + evaluated;
            }
          }
        }
        if (!sharedLibs.empty()) {
          os << "LOCAL_SHARED_LIBRARIES :=" << sharedLibs << "\n";
        }
        if (!staticLibs.empty()) {
          os << "LOCAL_STATIC_LIBRARIES :=" << staticLibs << "\n";
        }
        if (!ldlibs.empty()) {
          os << "LOCAL_EXPORT_LDLIBS :=" << ldlibs << "\n";
        }
      } else if (pi->first == "INTERFACE_INCLUDE_DIRECTORIES") {
        std::string includes = pi->second;
        std::vector<std::string> includeList;
        cmSystemTools::ExpandListArgument(includes, includeList);
        os << "LOCAL_EXPORT_C_INCLUDES := ";
        std::string end;
        for (std::vector<std::string>::iterator i = includeList.begin();
             i != includeList.end(); ++i) {
          os << end << *i;
          end = "\\\n";
        }
        os << "\n";
      } else {
        os << "# " << pi->first << " " << (pi->second) << "\n";
      }
    }
  }

  // Tell the NDK build system if prebuilt static libraries use C++.
  if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
    cmLinkImplementation const* li = target->GetLinkImplementation(config);
    if (std::find(li->Languages.begin(), li->Languages.end(), "CXX") !=
        li->Languages.end()) {
      os << "LOCAL_HAS_CPP := true\n";
    }
  }

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      os << "include $(PREBUILT_SHARED_LIBRARY)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "include $(PREBUILT_STATIC_LIBRARY)\n";
      break;
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::UTILITY:
    case cmStateEnums::OBJECT_LIBRARY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
  os << "\n";
}